

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abi_test.h
# Opt level: O2

void abi_test::internal::CheckGTest<void,P256_POINT*,P256_POINT_const*,P256_POINT_AFFINE_const*>
               (char *va_args_str,char *file,int line,bool unwind,
               _func_void_P256_POINT_ptr_P256_POINT_ptr_P256_POINT_AFFINE_ptr *func,Type args,
               Type args_1,Type args_2)

{
  pointer pbVar1;
  char *str;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *error;
  pointer pbVar2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  AssertHelper local_70;
  Result result;
  string local_50;
  
  result.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CheckImpl<void,P256_POINT*,P256_POINT_const*,P256_POINT_AFFINE_const*>
            (&result,unwind,func,args,args_1,args_2);
  if (result.errors.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      result.errors.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    testing::Message::Message((Message *)&local_78);
    std::operator<<((ostream *)(local_78._M_head_impl + 0x10),"ABI failures in ");
    FixVAArgsString_abi_cxx11_(&local_50,(internal *)va_args_str,str);
    std::operator<<((ostream *)(local_78._M_head_impl + 0x10),(string *)&local_50);
    std::operator<<((ostream *)(local_78._M_head_impl + 0x10),":\n");
    std::__cxx11::string::~string((string *)&local_50);
    pbVar1 = result.errors.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar2 = result.errors.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1)
    {
      std::operator<<((ostream *)(local_78._M_head_impl + 0x10),"    ");
      std::operator<<((ostream *)(local_78._M_head_impl + 0x10),(string *)pbVar2);
      std::operator<<((ostream *)(local_78._M_head_impl + 0x10),"\n");
    }
    testing::Message::Message((Message *)&local_50);
    testing::operator<<((ostream *)(local_50._M_dataplus._M_p + 0x10),(Message *)&local_78);
    testing::internal::AssertHelper::AssertHelper(&local_70,kNonFatalFailure,file,line,"Failed");
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result.errors);
  return;
}

Assistant:

inline R CheckGTest(const char *va_args_str, const char *file, int line,
                    bool unwind, R (*func)(Args...),
                    typename DeductionGuard<Args>::Type... args) {
  Result result;
  crypto_word_t ret = CheckImpl(&result, unwind, func, args...);
  if (!result.ok()) {
    testing::Message msg;
    msg << "ABI failures in " << FixVAArgsString(va_args_str) << ":\n";
    for (const auto &error : result.errors) {
      msg << "    " << error << "\n";
    }
    ADD_FAILURE_AT(file, line) << msg;
  }
  return (R)ret;
}